

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_mul.c
# Opt level: O3

unsigned_long bn_sub_part_words(unsigned_long *r,unsigned_long *a,unsigned_long *b,int cl,int dl)

{
  long lVar1;
  unsigned_long uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  unsigned_long *puVar6;
  ulong uVar7;
  unsigned_long *puVar8;
  uint uVar9;
  bool bVar10;
  
  uVar3 = bn_sub_words(r,a,b,cl);
  if (dl != 0) {
    puVar6 = r + cl;
    if (dl < 0) {
      uVar2 = b[cl];
      *puVar6 = -(uVar3 + uVar2);
      if (uVar2 != 0) {
        uVar3 = 1;
      }
      if (dl != -1) {
        lVar4 = 0;
        do {
          uVar9 = dl + (int)lVar4;
          uVar2 = b[(long)cl + lVar4 + 1];
          r[(long)cl + lVar4 + 1] = -(uVar3 + uVar2);
          if (uVar2 != 0) {
            uVar3 = 1;
          }
          if (uVar9 == 0xfffffffe) {
            return uVar3;
          }
          uVar2 = b[(long)cl + lVar4 + 2];
          r[(long)cl + lVar4 + 2] = -(uVar3 + uVar2);
          if (uVar2 != 0) {
            uVar3 = 1;
          }
          if (0xfffffffc < uVar9) {
            return uVar3;
          }
          uVar2 = b[(long)cl + lVar4 + 3];
          r[(long)cl + lVar4 + 3] = -(uVar3 + uVar2);
          if (uVar2 != 0) {
            uVar3 = 1;
          }
          if (uVar9 == 0xfffffffc) {
            return uVar3;
          }
          lVar1 = uVar3 + b[(long)cl + lVar4 + 4];
          if (b[(long)cl + lVar4 + 4] != 0) {
            uVar3 = 1;
          }
          r[(long)cl + lVar4 + 4] = -lVar1;
          lVar4 = lVar4 + 4;
        } while ((int)lVar4 + dl != -1);
      }
    }
    else {
      if (uVar3 == 0) {
        puVar8 = a + cl;
      }
      else {
        uVar5 = 0;
        uVar9 = dl;
        do {
          uVar2 = a[cl];
          r[cl] = uVar2 - uVar3;
          if (uVar2 != 0) {
            uVar3 = uVar5;
          }
          if ((int)uVar9 < 2) {
            return uVar3;
          }
          uVar2 = a[(long)cl + 1];
          r[(long)cl + 1] = uVar2 - uVar3;
          if (uVar2 != 0) {
            uVar3 = uVar5;
          }
          if (uVar9 == 2) {
            return uVar3;
          }
          uVar2 = a[(long)cl + 2];
          r[(long)cl + 2] = uVar2 - uVar3;
          if (uVar2 != 0) {
            uVar3 = uVar5;
          }
          dl = uVar9 - 4;
          if (uVar9 < 4) {
            return uVar3;
          }
          uVar2 = a[(long)cl + 3];
          r[(long)cl + 3] = uVar2 - uVar3;
          uVar7 = 0;
          if (uVar2 == 0) {
            uVar7 = uVar3;
          }
          if (uVar9 == 4) {
            return uVar7;
          }
          a = a + 4;
          r = r + 4;
          uVar9 = dl;
        } while (uVar7 != 0);
        puVar8 = a + cl;
        puVar6 = r + cl;
      }
      *puVar6 = *puVar8;
      if (dl == 1) {
        uVar3 = 0;
      }
      else {
        lVar4 = 4;
        uVar3 = 0;
        while (puVar6[lVar4 + -3] = puVar8[lVar4 + -3], dl != 2) {
          puVar6[lVar4 + -2] = puVar8[lVar4 + -2];
          bVar10 = (uint)dl < 4;
          dl = dl - 4;
          if (bVar10) {
            return 0;
          }
          puVar6[lVar4 + -1] = puVar8[lVar4 + -1];
          if (dl == 0) {
            return 0;
          }
          puVar6[lVar4] = puVar8[lVar4];
          lVar4 = lVar4 + 4;
          if ((uint)dl < 2) {
            return 0;
          }
        }
      }
    }
  }
  return uVar3;
}

Assistant:

BN_ULONG bn_sub_part_words(BN_ULONG *r,
                           const BN_ULONG *a, const BN_ULONG *b,
                           int cl, int dl)
{
    BN_ULONG c, t;

    assert(cl >= 0);
    c = bn_sub_words(r, a, b, cl);

    if (dl == 0)
        return c;

    r += cl;
    a += cl;
    b += cl;

    if (dl < 0) {
        for (;;) {
            t = b[0];
            r[0] = (0 - t - c) & BN_MASK2;
            if (t != 0)
                c = 1;
            if (++dl >= 0)
                break;

            t = b[1];
            r[1] = (0 - t - c) & BN_MASK2;
            if (t != 0)
                c = 1;
            if (++dl >= 0)
                break;

            t = b[2];
            r[2] = (0 - t - c) & BN_MASK2;
            if (t != 0)
                c = 1;
            if (++dl >= 0)
                break;

            t = b[3];
            r[3] = (0 - t - c) & BN_MASK2;
            if (t != 0)
                c = 1;
            if (++dl >= 0)
                break;

            b += 4;
            r += 4;
        }
    } else {
        int save_dl = dl;
        while (c) {
            t = a[0];
            r[0] = (t - c) & BN_MASK2;
            if (t != 0)
                c = 0;
            if (--dl <= 0)
                break;

            t = a[1];
            r[1] = (t - c) & BN_MASK2;
            if (t != 0)
                c = 0;
            if (--dl <= 0)
                break;

            t = a[2];
            r[2] = (t - c) & BN_MASK2;
            if (t != 0)
                c = 0;
            if (--dl <= 0)
                break;

            t = a[3];
            r[3] = (t - c) & BN_MASK2;
            if (t != 0)
                c = 0;
            if (--dl <= 0)
                break;

            save_dl = dl;
            a += 4;
            r += 4;
        }
        if (dl > 0) {
            if (save_dl > dl) {
                switch (save_dl - dl) {
                case 1:
                    r[1] = a[1];
                    if (--dl <= 0)
                        break;
                case 2:
                    r[2] = a[2];
                    if (--dl <= 0)
                        break;
                case 3:
                    r[3] = a[3];
                    if (--dl <= 0)
                        break;
                }
                a += 4;
                r += 4;
            }
        }
        if (dl > 0) {
            for (;;) {
                r[0] = a[0];
                if (--dl <= 0)
                    break;
                r[1] = a[1];
                if (--dl <= 0)
                    break;
                r[2] = a[2];
                if (--dl <= 0)
                    break;
                r[3] = a[3];
                if (--dl <= 0)
                    break;

                a += 4;
                r += 4;
            }
        }
    }
    return c;
}